

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O2

vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *
deqp::gles31::Functional::anon_unknown_0::getLevelAccesses
          (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
           *__return_storage_ptr__,
          vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
          *data,ImageInfo *info)

{
  long lVar1;
  int level;
  long lVar2;
  IVec3 levelSize;
  TextureFormat format;
  IVec3 size;
  int local_7c;
  int local_78;
  int local_74;
  TextureFormat local_70;
  Vector<int,_3> local_64;
  ConstPixelBufferAccess local_58;
  
  local_70 = glu::mapGLInternalFormat(info->m_format);
  tcu::Vector<int,_3>::Vector(&local_64,&info->m_size);
  (__return_storage_ptr__->
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar1 = 0;
  for (lVar2 = 0;
      lVar2 < (int)((ulong)((long)(data->
                                  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(data->
                                 super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start) >> 4);
      lVar2 = lVar2 + 1) {
    getLevelSize((anon_unknown_0 *)&local_7c,info->m_target,&local_64,(int)lVar2);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              (&local_58,&local_70,local_7c,local_78,local_74,
               *(void **)((long)&((data->
                                  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar1));
    std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
    emplace_back<tcu::ConstPixelBufferAccess>(__return_storage_ptr__,&local_58);
    lVar1 = lVar1 + 0x10;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<tcu::ConstPixelBufferAccess> getLevelAccesses (const vector<ArrayBuffer<deUint8> >& data, const ImageInfo& info)
{
	const tcu::TextureFormat			format	= glu::mapGLInternalFormat(info.getFormat());
	const IVec3							size	= info.getSize();

	vector<tcu::ConstPixelBufferAccess>	result;

	DE_ASSERT((int)data.size() == getLevelCount(info));

	for (int level = 0; level < (int)data.size(); level++)
	{
		const IVec3 levelSize = getLevelSize(info.getTarget(), size, level);

		result.push_back(tcu::ConstPixelBufferAccess(format, levelSize.x(), levelSize.y(), levelSize.z(), data[level].getPtr()));
	}

	return result;
}